

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseModuleTypesCtx::addFunc
          (Result<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *this,Name name,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2,ImportNames *param_3,
          TypeUse *type,
          optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_> *locals,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *param_6
          ,Index pos)

{
  char **ppcVar1;
  uint index;
  bool bVar2;
  pointer pFVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  IString *this_00;
  reference pvVar6;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *this_01;
  Ok local_f1;
  uintptr_t local_f0;
  Function *local_e8;
  char *local_e0;
  reference local_d8;
  NameType *l;
  iterator __end3;
  iterator __begin3;
  vector<wasm::NameType,_std::allocator<wasm::NameType>_> *__range3;
  size_t local_a8;
  size_type local_a0;
  uint local_98;
  Index i;
  allocator<char> local_81;
  string local_80;
  Err local_60;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *local_40;
  value_type *f;
  ImportNames *param_3_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *param_2_local;
  ParseModuleTypesCtx *this_local;
  Name name_local;
  
  name_local.super_IString.str._M_len = name.super_IString.str._M_str;
  this_local = name.super_IString.str._M_len;
  f = (value_type *)param_3;
  param_3_local = (ImportNames *)param_2;
  param_2_local = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)this;
  name_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  local_40 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::operator[](&this->wasm->functions,(ulong)this->index);
  bVar2 = HeapType::isSignature(&type->type);
  if (bVar2) {
    pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                       (local_40);
    (pFVar3->type).id = (type->type).id;
    local_98 = 0;
    while( true ) {
      uVar4 = (ulong)local_98;
      local_a0 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(&type->names);
      pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                         (local_40);
      local_a8 = Function::getNumLocals(pFVar3);
      puVar5 = std::min<unsigned_long>(&local_a0,&local_a8);
      if (*puVar5 <= uVar4) break;
      this_00 = &std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                           (&type->names,(ulong)local_98)->super_IString;
      bVar2 = IString::is(this_00);
      if (bVar2) {
        pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                           (local_40);
        index = local_98;
        pvVar6 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::operator[]
                           (&type->names,(ulong)local_98);
        Function::setLocalName(pFVar3,index,(Name)(pvVar6->super_IString).str);
      }
      local_98 = local_98 + 1;
    }
    bVar2 = std::optional::operator_cast_to_bool((optional *)locals);
    if (bVar2) {
      this_01 = std::optional<std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>::
                operator*(locals);
      __end3 = std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::begin(this_01);
      l = (NameType *)std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>::end(this_01);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                                         *)&l), bVar2) {
        local_d8 = __gnu_cxx::
                   __normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
                   ::operator*(&__end3);
        pFVar3 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                           (local_40);
        local_e8 = (Function *)(local_d8->name).super_IString.str._M_len;
        ppcVar1 = &(local_d8->name).super_IString.str._M_str;
        local_e0 = *ppcVar1;
        local_f0 = (local_d8->type).id;
        Builder::addVar((Builder *)pFVar3,local_e8,(IString)*(IString *)ppcVar1,(Type)param_2);
        __gnu_cxx::
        __normal_iterator<wasm::NameType_*,_std::vector<wasm::NameType,_std::allocator<wasm::NameType>_>_>
        ::operator++(&__end3);
      }
    }
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_f1);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"expected signature type",&local_81);
    Lexer::err(&local_60,&this->in,(ulong)pos,&local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_60);
    wasm::Err::~Err(&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> addFunc(Name name,
                   const std::vector<Name>&,
                   ImportNames*,
                   TypeUse type,
                   std::optional<LocalsT> locals,
                   std::vector<Annotation>&&,
                   Index pos) {
    auto& f = wasm.functions[index];
    if (!type.type.isSignature()) {
      return in.err(pos, "expected signature type");
    }
    f->type = type.type;
    // If we are provided with too many names (more than the function has), we
    // will error on that later when we check the signature matches the type.
    // For now, avoid asserting in setLocalName.
    for (Index i = 0; i < std::min(type.names.size(), f->getNumLocals()); ++i) {
      if (type.names[i].is()) {
        f->setLocalName(i, type.names[i]);
      }
    }
    if (locals) {
      for (auto& l : *locals) {
        Builder::addVar(f.get(), l.name, l.type);
      }
    }
    return Ok{};
  }